

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Scope>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Scope *scope,
               string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  AttrMeta *pAVar3;
  AttrMeta *pAVar4;
  size_type sVar5;
  Property *pPVar6;
  mapped_type *this;
  ostream *poVar7;
  bool local_591;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  ostringstream local_528 [8];
  ostringstream ss_w_1;
  allocator local_389;
  value_type local_388 [4];
  int local_364;
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_360;
  allocator local_339;
  string local_338;
  undefined1 local_318 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_2d9;
  value_type local_2d8 [4];
  Attribute *local_2b8;
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [32];
  ostringstream local_270 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  allocator local_b1;
  key_type local_b0 [4];
  reference_conflict local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  Scope *scope_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range2);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(properties);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
    local_90 = ::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
               ::operator*(&__end2);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"visibility");
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_b0,"visibility",&local_b1);
      sVar5 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,local_b0);
      ::std::__cxx11::string::~string((string *)local_b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      if (sVar5 == 0) {
        Property::value_type_name_abi_cxx11_(&local_d8,&local_90->second);
        tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
        _Var2 = ::std::operator==(&local_d8,&local_f8);
        local_591 = false;
        if (_Var2) {
          bVar1 = Property::is_attribute(&local_90->second);
          local_591 = false;
          if (bVar1) {
            local_591 = Property::is_empty(&local_90->second);
          }
        }
        ::std::__cxx11::string::~string((string *)&local_f8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        if (local_591 == false) {
          fun._M_invoker = (_Invoker_type)Property::get_attribute(&local_90->second);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
          ::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                    ((function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                      *)local_318,VisibilityEnumHandler);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_338,"visibility",&local_339);
          bVar1 = options->strict_allowedToken_check;
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function(&local_360,
                     (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_318);
          bVar1 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                            (&local_338,(bool)(bVar1 & 1),&local_360,(Attribute *)fun._M_invoker,
                             &scope->visibility,warn,
                             (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function(&local_360);
          ::std::__cxx11::string::~string((string *)&local_338);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            pAVar3 = Attribute::metas((Attribute *)fun._M_invoker);
            pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                               (&scope->visibility);
            AttrMetas::operator=(pAVar4,pAVar3);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_388,"visibility",&local_389);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2,local_388);
            ::std::__cxx11::string::~string((string *)local_388);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
            local_364 = 3;
          }
          else {
            spec_local._7_1_ = 0;
            local_364 = 1;
          }
          ::std::
          function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_318);
          if (local_364 != 3) goto LAB_00299cb3;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_270);
          poVar7 = ::std::operator<<((ostream *)local_270,"[warn]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb16);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)local_270,"No value assigned to `");
          poVar7 = ::std::operator<<(poVar7,"visibility");
          poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
          ::std::operator<<(poVar7,"\n");
          if (warn != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_290,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &attr);
            ::std::__cxx11::string::operator=((string *)warn,(string *)local_290);
            ::std::__cxx11::string::~string((string *)local_290);
            ::std::__cxx11::string::~string((string *)&attr);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_270);
          local_2b8 = Property::get_attribute(&local_90->second);
          pAVar3 = Attribute::metas(local_2b8);
          pAVar4 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                             (&scope->visibility);
          AttrMetas::operator=(pAVar4,pAVar3);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_2d8,"visibility",&local_2d9);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2,local_2d8);
          ::std::__cxx11::string::~string((string *)local_2d8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
        }
      }
    }
    else {
      sVar5 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(key_type *)local_90);
      if (sVar5 == 0) {
        pPVar6 = &local_90->second;
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&scope->props,(key_type *)local_90);
        Property::operator=(this,pPVar6);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,&local_90->first);
      }
      sVar5 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(key_type *)local_90);
      if (sVar5 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_528);
        poVar7 = ::std::operator<<((ostream *)local_528,"[warn]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xb18);
        ::std::operator<<(poVar7," ");
        ::std::operator+(&local_548,"Unsupported/unimplemented property: ",&local_90->first);
        poVar7 = ::std::operator<<((ostream *)local_528,(string *)&local_548);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_548);
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_568,local_588);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_568);
          ::std::__cxx11::string::~string((string *)local_568);
          ::std::__cxx11::string::~string((string *)local_588);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_528);
      }
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  }
  spec_local._7_1_ = 1;
  local_364 = 1;
LAB_00299cb3:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range2);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<Scope>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Scope *scope,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  // `Scope` is just a namespace in scene graph(no node xform)

  (void)spec;
  (void)references;
  (void)scope;
  (void)err;
  (void)options;

  DCOUT("Scope");
  std::set<std::string> table;
  for (const auto &prop : properties) {
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, Scope,
                   scope->visibility, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, Scope, scope->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}